

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void fdb_assert_die(char *expression,char *file,int line,uint64_t val,uint64_t expected)

{
  undefined8 in_RCX;
  uint in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  
  fprintf(_stderr,"assertion failed [%s] at %s:%u (%p != %p)\n",in_RDI,in_RSI,(ulong)in_EDX,in_RCX);
  if (fatal_error_callback != (fdb_fatal_error_callback)0x0) {
    (*fatal_error_callback)();
  }
  _dbg_hang_process();
  initialize_breakpad(minidump_dir);
  fflush(_stderr);
  abort();
}

Assistant:

void fdb_assert_die(const char* expression, const char* file, int line,
                    uint64_t val, uint64_t expected) {
    fprintf(stderr, "assertion failed [%s] at %s:%u (%p != %p)\n",
            expression, file, line, (void*)val, (void*)expected);

    // Invoke the fatal error callback if registered.
    if (fatal_error_callback != nullptr) {
        fatal_error_callback();
    }

    _dbg_hang_process(); // Only if HANG_ON_CRASH is set in env

    // Initialize breakpad to create minidump for the
    // following abort
    initialize_breakpad(minidump_dir);

    fflush(stderr);

    abort();
}